

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

MAFSA_automaton MAFSA_automaton_load_from_binary_memo(void *bmemo,int *error)

{
  uint uVar1;
  MAFSA_automaton __ptr;
  uint32_t *__dest;
  uint32_t *__dest_00;
  size_t __size;
  size_t __size_00;
  
  if (error == (int *)0x0) {
    __ptr = (MAFSA_automaton)malloc(0x18);
    if (__ptr == (MAFSA_automaton)0x0) {
      return (MAFSA_automaton)0x0;
    }
  }
  else {
    *error = 0;
    __ptr = (MAFSA_automaton)malloc(0x18);
    if (__ptr == (MAFSA_automaton)0x0) {
      *error = 1;
      return (MAFSA_automaton)0x0;
    }
  }
  uVar1 = *(uint *)((long)bmemo + 4);
  __size_00 = (ulong)*bmemo * 4;
  __dest = (uint32_t *)malloc(__size_00);
  __ptr->ptr_nodes = __dest;
  if (__dest == (uint32_t *)0x0) {
    if (error != (int *)0x0) {
      *error = 1;
    }
  }
  else {
    memcpy(__dest,(void *)((long)bmemo + 8),__size_00);
    __size = (ulong)uVar1 << 2;
    __dest_00 = (uint32_t *)malloc(__size);
    __ptr->ptr_links = __dest_00;
    if (__dest_00 != (uint32_t *)0x0) {
      memcpy(__dest_00,(void *)((long)bmemo + 8 + __size_00),__size);
      __ptr->shared = 0;
      return __ptr;
    }
    if (error != (int *)0x0) {
      *error = 1;
    }
    free(__dest);
  }
  free(__ptr);
  return (MAFSA_automaton)0x0;
}

Assistant:

extern MAFSA_automaton MAFSA_automaton_load_from_binary_memo(const void *bmemo, int *error)
{
    uint32_t nodes_count;
    uint32_t links_count;

    const uint8_t *mem_p = (const uint8_t *) bmemo;
    MAFSA_automaton ret_data;

    if (error) *error = 0;

    ret_data = (MAFSA_automaton) malloc(sizeof(struct MAFSA_automaton_struct));

    if (0 == ret_data)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        return 0;
    }

    memcpy(&nodes_count, mem_p, sizeof(uint32_t));
    mem_p += sizeof(uint32_t);

    memcpy(&links_count, mem_p, sizeof(uint32_t));
    mem_p += sizeof(uint32_t);

    ret_data->ptr_nodes = (uint32_t *) malloc(nodes_count * sizeof(uint32_t));

    if (0 == ret_data->ptr_nodes)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        free(ret_data);
        return 0;
    }

    memcpy(ret_data->ptr_nodes, mem_p, sizeof(uint32_t) * nodes_count);
    mem_p += sizeof(uint32_t) * nodes_count;

    ret_data->ptr_links = (uint32_t*)malloc(links_count * sizeof(uint32_t));

    if (0 == ret_data->ptr_links)
    {
        if (error) *error = MAFSA_ERROR_NOMEM;
        free(ret_data->ptr_nodes);
        free(ret_data);
        return 0;
    }

    memcpy(ret_data->ptr_links, mem_p, sizeof(uint32_t) * links_count);
    mem_p += sizeof(uint32_t) * links_count;

    ret_data->shared = 0;
    return ret_data;
}